

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
          (DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>> *this,
          key_type_conflict *key,result_pair_type *result,size_t result_len,size_t len,
          size_t node_pos)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  
  if (len == 0) {
    len = strlen(key);
  }
  lVar2 = *(long *)this;
  uVar4 = *(uint *)(lVar2 + node_pos * 8);
  bVar7 = len != 0;
  if (len == 0) {
    sVar3 = 0;
  }
  else {
    sVar5 = 0;
    sVar3 = 0;
    do {
      uVar1 = *(uint *)(lVar2 + (ulong)uVar4 * 8);
      if ((int)uVar1 < 0 && uVar4 == *(uint *)(lVar2 + 4 + (ulong)uVar4 * 8)) {
        if (sVar3 < result_len) {
          result[sVar3].value = ~uVar1;
          result[sVar3].length = sVar5;
        }
        sVar3 = sVar3 + 1;
      }
      uVar6 = (ulong)((byte)key[sVar5] + uVar4 + 1);
      if (uVar4 != *(uint *)(lVar2 + 4 + uVar6 * 8)) break;
      sVar5 = sVar5 + 1;
      uVar4 = *(uint *)(lVar2 + uVar6 * 8);
      bVar7 = sVar5 < len;
    } while (sVar5 != len);
  }
  if ((!bVar7) &&
     (uVar1 = *(uint *)(lVar2 + (ulong)uVar4 * 8),
     (int)uVar1 < 0 && uVar4 == *(uint *)(lVar2 + 4 + (ulong)uVar4 * 8))) {
    if (sVar3 < result_len) {
      result[sVar3].value = ~uVar1;
      result[sVar3].length = len;
    }
    sVar3 = sVar3 + 1;
  }
  return sVar3;
}

Assistant:

size_t commonPrefixSearch(const key_type *key,
                            T* result,
                            size_t result_len,
                            size_t len = 0,
                            size_t node_pos = 0) const {
    if (!len) len = length_func_()(key);

    register array_type_  b   = array_[node_pos].base;
    register size_t     num = 0;
    register array_type_  n;
    register array_u_type_ p;

    for (register size_t i = 0; i < len; ++i) {
      p = b;  // + 0;
      n = array_[p].base;
      if ((array_u_type_) b == array_[p].check && n < 0) {
        // result[num] = -n-1;
        if (num < result_len) set_result(result[num], -n-1, i);
        ++num;
      }

      p = b +(node_u_type_)(key[i]) + 1;
      if ((array_u_type_) b == array_[p].check)
        b = array_[p].base;
      else
        return num;
    }

    p = b;
    n = array_[p].base;

    if ((array_u_type_)b == array_[p].check && n < 0) {
      if (num < result_len) set_result(result[num], -n-1, len);
      ++num;
    }

    return num;
  }